

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amd_ext_to_khr.cpp
# Opt level: O1

bool spvtools::opt::anon_unknown_7::ReplaceTrinaryMinMax<(GLSLstd450)37>
               (IRContext *ctx,Instruction *inst,
               vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
               *param_3)

{
  uint *puVar1;
  IRContext *pIVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t result_type;
  array<signed_char,_4UL> aVar5;
  Instruction *this;
  uint uVar6;
  OperandList new_operands;
  InstructionBuilder ir_builder;
  undefined1 local_d8 [24];
  uint local_c0 [2];
  uint *local_b8;
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_b0;
  array<signed_char,_4UL> local_a4;
  undefined1 local_a0 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_80;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_78;
  IRContext *local_58;
  InstructionBuilder local_50;
  
  if ((ctx->feature_mgr_)._M_t.
      super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
      ._M_t.
      super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
      .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl ==
      (FeatureManager *)0x0) {
    IRContext::AnalyzeFeatures(ctx);
  }
  aVar5._M_elems =
       (_Type)((ctx->feature_mgr_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
               .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl)->
              extinst_importid_GLSLstd450_;
  if (aVar5._M_elems == (_Type)0x0) {
    local_d8._0_8_ = local_d8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"GLSL.std.450","");
    IRContext::AddExtInstImport(ctx,(string *)local_d8);
    if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
      operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
    }
    if ((ctx->feature_mgr_)._M_t.
        super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
        ._M_t.
        super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
        .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl ==
        (FeatureManager *)0x0) {
      IRContext::AnalyzeFeatures(ctx);
    }
    aVar5._M_elems =
         (_Type)((ctx->feature_mgr_)._M_t.
                 super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
                 .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl)->
                extinst_importid_GLSLstd450_;
  }
  local_50.parent_ = IRContext::get_instr_block(ctx,inst);
  local_50.preserved_analyses_ = kAnalysisInstrToBlockMapping|kAnalysisBegin;
  uVar6 = (inst->has_result_id_ & 1) + 1;
  if (inst->has_type_id_ == false) {
    uVar6 = (uint)inst->has_result_id_;
  }
  local_58 = ctx;
  local_50.context_ = ctx;
  local_50.insert_before_.super_iterator.node_ = (iterator)(iterator)inst;
  uVar3 = Instruction::GetSingleWordOperand(inst,uVar6 + 2);
  uVar6 = (inst->has_result_id_ & 1) + 1;
  if (inst->has_type_id_ == false) {
    uVar6 = (uint)inst->has_result_id_;
  }
  uVar4 = Instruction::GetSingleWordOperand(inst,uVar6 + 3);
  uVar6 = (inst->has_result_id_ & 1) + 1;
  if (inst->has_type_id_ == false) {
    uVar6 = (uint)inst->has_result_id_;
  }
  local_a4._M_elems = (_Type)Instruction::GetSingleWordOperand(inst,uVar6 | 4);
  result_type = 0;
  if (inst->has_type_id_ == true) {
    result_type = Instruction::GetSingleWordOperand(inst,0);
  }
  local_d8._0_8_ = (pointer)0x0;
  local_d8._8_8_ = (_func_int **)0x0;
  local_d8._16_8_ = 0;
  local_d8._0_8_ = operator_new(8);
  local_d8._8_8_ = local_d8._0_8_ + 8;
  *(ulong *)local_d8._0_8_ = CONCAT44(uVar4,uVar3);
  local_d8._16_8_ = local_d8._8_8_;
  this = InstructionBuilder::AddNaryExtendedInstruction
                   (&local_50,result_type,(uint32_t)aVar5._M_elems,0x25,
                    (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_d8);
  if ((pointer)local_d8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_d8._0_8_,local_d8._16_8_ - local_d8._0_8_);
  }
  local_78.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  puVar1 = (uint *)(local_a0 + 0x10);
  local_a0._0_8_ = &PTR__SmallVector_00b15d78;
  local_80._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_a0._8_8_ = 1;
  local_d8._0_4_ = 1;
  local_d8._8_8_ = &PTR__SmallVector_00b15d78;
  local_d8._16_8_ = 0;
  local_b8 = local_c0;
  local_b0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_a0._16_4_ = aVar5._M_elems;
  local_a0._24_8_ = puVar1;
  utils::SmallVector<unsigned_int,_2UL>::operator=
            ((SmallVector<unsigned_int,_2UL> *)(local_d8 + 8),
             (SmallVector<unsigned_int,_2UL> *)local_a0);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
  emplace_back<spvtools::opt::Operand>(&local_78,(Operand *)local_d8);
  local_d8._8_8_ = &PTR__SmallVector_00b15d78;
  if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       )local_b0._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
              ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &local_b0,local_b0._M_head_impl);
  }
  local_b0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_a0._0_8_ = &PTR__SmallVector_00b15d78;
  if (local_80._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
              ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &local_80,local_80._M_head_impl);
  }
  local_a0._0_8_ = &PTR__SmallVector_00b15d78;
  local_80._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_a0[0x10] = '%';
  local_a0[0x11] = '\0';
  local_a0[0x12] = '\0';
  local_a0[0x13] = '\0';
  local_a0._8_8_ = 1;
  local_d8._0_4_ = 7;
  local_d8._8_8_ = &PTR__SmallVector_00b15d78;
  local_d8._16_8_ = 0;
  local_b8 = local_c0;
  local_b0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_a0._24_8_ = puVar1;
  utils::SmallVector<unsigned_int,_2UL>::operator=
            ((SmallVector<unsigned_int,_2UL> *)(local_d8 + 8),
             (SmallVector<unsigned_int,_2UL> *)local_a0);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
  emplace_back<spvtools::opt::Operand>(&local_78,(Operand *)local_d8);
  local_d8._8_8_ = &PTR__SmallVector_00b15d78;
  if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       )local_b0._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
              ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &local_b0,local_b0._M_head_impl);
  }
  local_b0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_a0._0_8_ = &PTR__SmallVector_00b15d78;
  if (local_80._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
              ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &local_80,local_80._M_head_impl);
  }
  aVar5._M_elems[0] = '\0';
  aVar5._M_elems[1] = '\0';
  aVar5._M_elems[2] = '\0';
  aVar5._M_elems[3] = '\0';
  if (this->has_result_id_ == true) {
    aVar5._M_elems = (_Type)Instruction::GetSingleWordOperand(this,(uint)this->has_type_id_);
  }
  local_a0._0_8_ = &PTR__SmallVector_00b15d78;
  local_80._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_a0._8_8_ = 1;
  local_d8._0_4_ = 1;
  local_d8._8_8_ = &PTR__SmallVector_00b15d78;
  local_d8._16_8_ = 0;
  local_b8 = local_c0;
  local_b0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_a0._16_4_ = aVar5._M_elems;
  local_a0._24_8_ = puVar1;
  utils::SmallVector<unsigned_int,_2UL>::operator=
            ((SmallVector<unsigned_int,_2UL> *)(local_d8 + 8),
             (SmallVector<unsigned_int,_2UL> *)local_a0);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
  emplace_back<spvtools::opt::Operand>(&local_78,(Operand *)local_d8);
  local_d8._8_8_ = &PTR__SmallVector_00b15d78;
  if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       )local_b0._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
              ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &local_b0,local_b0._M_head_impl);
  }
  pIVar2 = local_58;
  local_b0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_a0._0_8_ = &PTR__SmallVector_00b15d78;
  if (local_80._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
              ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &local_80,local_80._M_head_impl);
  }
  local_a0._0_8_ = &PTR__SmallVector_00b15d78;
  local_80._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_a0[0x10] = local_a4._M_elems[0];
  local_a0[0x11] = local_a4._M_elems[1];
  local_a0[0x12] = local_a4._M_elems[2];
  local_a0[0x13] = local_a4._M_elems[3];
  local_a0._8_8_ = 1;
  local_d8._0_4_ = 1;
  local_d8._8_8_ = &PTR__SmallVector_00b15d78;
  local_d8._16_8_ = 0;
  local_b8 = local_c0;
  local_b0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_a0._24_8_ = puVar1;
  utils::SmallVector<unsigned_int,_2UL>::operator=
            ((SmallVector<unsigned_int,_2UL> *)(local_d8 + 8),
             (SmallVector<unsigned_int,_2UL> *)local_a0);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
  emplace_back<spvtools::opt::Operand>(&local_78,(Operand *)local_d8);
  local_d8._8_8_ = &PTR__SmallVector_00b15d78;
  if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       )local_b0._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
              ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &local_b0,local_b0._M_head_impl);
  }
  local_b0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_a0._0_8_ = &PTR__SmallVector_00b15d78;
  if (local_80._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
              ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &local_80,local_80._M_head_impl);
  }
  uVar6 = (inst->has_result_id_ & 1) + 1;
  if (inst->has_type_id_ == false) {
    uVar6 = (uint)inst->has_result_id_;
  }
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::_M_erase
            (&inst->operands_,
             (Operand *)
             ((long)((((inst->operands_).
                       super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                       ._M_impl.super__Vector_impl_data._M_start)->words).buffer +
                    0xfffffffffffffffa) + (ulong)(uVar6 * 0x30)),
             (inst->operands_).
             super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<spvtools::opt::Operand*,std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>>>
            ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)
             &inst->operands_,
             (inst->operands_).
             super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
             _M_impl.super__Vector_impl_data._M_finish,
             local_78.
             super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
             _M_impl.super__Vector_impl_data._M_start,
             local_78.
             super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  if ((pIVar2->valid_analyses_ & kAnalysisBegin) != kAnalysisNone) {
    analysis::DefUseManager::UpdateDefUse
              ((pIVar2->def_use_mgr_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
               .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl,
               inst);
  }
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector(&local_78);
  return true;
}

Assistant:

bool ReplaceTrinaryMinMax(IRContext* ctx, Instruction* inst,
                          const std::vector<const analysis::Constant*>&) {
  uint32_t glsl405_ext_inst_id =
      ctx->get_feature_mgr()->GetExtInstImportId_GLSLstd450();
  if (glsl405_ext_inst_id == 0) {
    ctx->AddExtInstImport("GLSL.std.450");
    glsl405_ext_inst_id =
        ctx->get_feature_mgr()->GetExtInstImportId_GLSLstd450();
  }

  InstructionBuilder ir_builder(
      ctx, inst,
      IRContext::kAnalysisDefUse | IRContext::kAnalysisInstrToBlockMapping);

  uint32_t op1 = inst->GetSingleWordInOperand(2);
  uint32_t op2 = inst->GetSingleWordInOperand(3);
  uint32_t op3 = inst->GetSingleWordInOperand(4);

  Instruction* temp = ir_builder.AddNaryExtendedInstruction(
      inst->type_id(), glsl405_ext_inst_id, opcode, {op1, op2});

  Instruction::OperandList new_operands;
  new_operands.push_back({SPV_OPERAND_TYPE_ID, {glsl405_ext_inst_id}});
  new_operands.push_back({SPV_OPERAND_TYPE_EXTENSION_INSTRUCTION_NUMBER,
                          {static_cast<uint32_t>(opcode)}});
  new_operands.push_back({SPV_OPERAND_TYPE_ID, {temp->result_id()}});
  new_operands.push_back({SPV_OPERAND_TYPE_ID, {op3}});

  inst->SetInOperands(std::move(new_operands));
  ctx->UpdateDefUse(inst);
  return true;
}